

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

bool tinyusdz::tydra::(anonymous_namespace)::
     TryConvertFacevaryingToVertexFloat<std::array<double,2ul>,double>
               (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *src,
               vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,double eps)

{
  uint uVar1;
  pointer puVar2;
  _Hash_node_base *p_Var3;
  pointer paVar4;
  _Hash_node_base *p_Var5;
  pointer puVar6;
  mapped_type *pmVar7;
  __node_base _Var8;
  __hash_code __code;
  ulong uVar9;
  bool bVar10;
  uint uVar11;
  size_type __new_size;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  uint32_t vidx;
  unordered_map<unsigned_int,_std::array<double,_2UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_2UL>_>_>_>
  vdata;
  uint local_7c;
  double local_78;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (dst == (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)0x0) {
    bVar10 = false;
  }
  else {
    puVar6 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    uVar9 = (long)puVar2 - (long)puVar6 >> 2;
    bVar10 = false;
    if (((long)(src->
               super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(src->
               super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 4 == uVar9) && (2 < uVar9)) {
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      local_78 = eps;
      if (puVar2 == puVar6) {
        __new_size = 1;
      }
      else {
        uVar9 = 0;
        uVar11 = 0;
        local_70 = dst;
        do {
          local_7c = puVar6[uVar9];
          if (uVar11 < local_7c) {
            uVar11 = local_7c;
          }
          if (local_68._M_buckets[(ulong)local_7c % local_68._M_bucket_count] !=
              (__node_base_ptr)0x0) {
            p_Var3 = local_68._M_buckets[(ulong)local_7c % local_68._M_bucket_count]->_M_nxt;
            uVar1 = *(uint *)&p_Var3[1]._M_nxt;
            do {
              if (local_7c == uVar1) {
                pmVar7 = ::std::__detail::
                         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&local_68,&local_7c);
                paVar4 = (src->
                         super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                dVar13 = paVar4[uVar9]._M_elems[0];
                dVar12 = ABS(pmVar7->_M_elems[0] - dVar13);
                if (local_78 < dVar12) {
                  dVar15 = ABS(pmVar7->_M_elems[0]);
                  dVar13 = ABS(dVar13);
                  dVar14 = dVar13;
                  if (dVar13 <= dVar15) {
                    dVar14 = dVar15;
                  }
                  if (dVar12 <= (double)(~-(ulong)NAN(dVar15) & (ulong)dVar14 |
                                        -(ulong)NAN(dVar15) & (ulong)dVar13) * local_78)
                  goto LAB_00379157;
                }
                else {
LAB_00379157:
                  dVar13 = paVar4[uVar9]._M_elems[1];
                  dVar12 = ABS(pmVar7->_M_elems[1] - dVar13);
                  if (dVar12 <= local_78) goto LAB_003791e2;
                  dVar15 = ABS(pmVar7->_M_elems[1]);
                  dVar13 = ABS(dVar13);
                  dVar14 = dVar13;
                  if (dVar13 <= dVar15) {
                    dVar14 = dVar15;
                  }
                  if (dVar12 <= (double)(~-(ulong)NAN(dVar15) & (ulong)dVar14 |
                                        -(ulong)NAN(dVar15) & (ulong)dVar13) * local_78)
                  goto LAB_003791e2;
                }
                bVar10 = false;
                goto LAB_00379254;
              }
              p_Var3 = p_Var3->_M_nxt;
            } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                    (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
                    (ulong)uVar1 % local_68._M_bucket_count ==
                    (ulong)local_7c % local_68._M_bucket_count));
          }
          paVar4 = (src->
                   super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pmVar7 = ::std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_68,&local_7c);
          paVar4 = paVar4 + uVar9;
          dVar13 = paVar4->_M_elems[1];
          pmVar7->_M_elems[0] = paVar4->_M_elems[0];
          pmVar7->_M_elems[1] = dVar13;
LAB_003791e2:
          uVar9 = uVar9 + 1;
          puVar6 = (faceVertexIndices->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar9 < (ulong)((long)(faceVertexIndices->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >>
                                2));
        __new_size = (size_type)(uVar11 + 1);
        dst = local_70;
      }
      ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::resize
                (dst,__new_size);
      memset((dst->
             super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>)
             ._M_impl.super__Vector_impl_data._M_start,0,__new_size << 4);
      bVar10 = true;
      for (_Var8._M_nxt = local_68._M_before_begin._M_nxt; _Var8._M_nxt != (_Hash_node_base *)0x0;
          _Var8._M_nxt = (_Var8._M_nxt)->_M_nxt) {
        p_Var5 = _Var8._M_nxt[3]._M_nxt;
        paVar4 = (dst->
                 super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + *(uint *)&_Var8._M_nxt[1]._M_nxt;
        paVar4->_M_elems[0] = (double)_Var8._M_nxt[2]._M_nxt;
        paVar4->_M_elems[1] = (double)p_Var5;
      }
LAB_00379254:
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
    }
  }
  return bVar10;
}

Assistant:

bool TryConvertFacevaryingToVertexFloat(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices, const EpsTy eps) {
  DCOUT("TryConvertFacevaryingToVertexFloat");
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    DCOUT("size mismatch.");
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!math::is_close(vdata[vidx], src[i], eps)) {
        DCOUT("diff at faceVertexIndices[" << i << "]");
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->resize(max_vidx + 1);
  memset(dst->data(), 0, (max_vidx + 1) * sizeof(T));

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}